

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

char * google::protobuf::compiler::java::GetCapitalizedType(FieldDescriptor *field,bool immutable)

{
  Type TVar1;
  LogMessage *this;
  byte in_SIL;
  LogMessage *other;
  LogMessage *in_stack_ffffffffffffff90;
  LogMessage *in_stack_ffffffffffffffa0;
  LogMessage local_50;
  byte local_11;
  char *local_8;
  
  local_11 = in_SIL & 1;
  TVar1 = GetType((FieldDescriptor *)0x45c33c);
  switch(TVar1) {
  case TYPE_DOUBLE:
    local_8 = "Double";
    break;
  case TYPE_FLOAT:
    local_8 = "Float";
    break;
  case TYPE_INT64:
    local_8 = "Int64";
    break;
  case TYPE_UINT64:
    local_8 = "UInt64";
    break;
  case TYPE_INT32:
    local_8 = "Int32";
    break;
  case TYPE_FIXED64:
    local_8 = "Fixed64";
    break;
  case TYPE_FIXED32:
    local_8 = "Fixed32";
    break;
  case TYPE_BOOL:
    local_8 = "Bool";
    break;
  case TYPE_STRING:
    local_8 = "String";
    break;
  case TYPE_GROUP:
    local_8 = "Group";
    break;
  case TYPE_MESSAGE:
    local_8 = "Message";
    break;
  case TYPE_BYTES:
    local_8 = "Bytes";
    break;
  case TYPE_UINT32:
    local_8 = "UInt32";
    break;
  case TYPE_ENUM:
    local_8 = "Enum";
    break;
  case TYPE_SFIXED32:
    local_8 = "SFixed32";
    break;
  case TYPE_SFIXED64:
    local_8 = "SFixed64";
    break;
  case TYPE_SINT32:
    local_8 = "SInt32";
    break;
  case MAX_TYPE:
    local_8 = "SInt64";
    break;
  default:
    other = &local_50;
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffffa0,LOGLEVEL_INFO,(char *)in_stack_ffffffffffffff90,
               (int)((ulong)other >> 0x20));
    this = internal::LogMessage::operator<<(in_stack_ffffffffffffff90,(char *)other);
    internal::LogFinisher::operator=((LogFinisher *)this,other);
    internal::LogMessage::~LogMessage((LogMessage *)0x45c4e3);
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char* GetCapitalizedType(const FieldDescriptor* field, bool immutable) {
  switch (GetType(field)) {
    case FieldDescriptor::TYPE_INT32:
      return "Int32";
    case FieldDescriptor::TYPE_UINT32:
      return "UInt32";
    case FieldDescriptor::TYPE_SINT32:
      return "SInt32";
    case FieldDescriptor::TYPE_FIXED32:
      return "Fixed32";
    case FieldDescriptor::TYPE_SFIXED32:
      return "SFixed32";
    case FieldDescriptor::TYPE_INT64:
      return "Int64";
    case FieldDescriptor::TYPE_UINT64:
      return "UInt64";
    case FieldDescriptor::TYPE_SINT64:
      return "SInt64";
    case FieldDescriptor::TYPE_FIXED64:
      return "Fixed64";
    case FieldDescriptor::TYPE_SFIXED64:
      return "SFixed64";
    case FieldDescriptor::TYPE_FLOAT:
      return "Float";
    case FieldDescriptor::TYPE_DOUBLE:
      return "Double";
    case FieldDescriptor::TYPE_BOOL:
      return "Bool";
    case FieldDescriptor::TYPE_STRING:
      return "String";
    case FieldDescriptor::TYPE_BYTES: {
      return "Bytes";
    }
    case FieldDescriptor::TYPE_ENUM:
      return "Enum";
    case FieldDescriptor::TYPE_GROUP:
      return "Group";
    case FieldDescriptor::TYPE_MESSAGE:
      return "Message";

      // No default because we want the compiler to complain if any new
      // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}